

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Div::applyPoint
          (Interval *__return_storage_ptr__,Div *this,EvalContext *ctx,double x,double y)

{
  Interval dst;
  Interval local_48;
  Interval local_30;
  
  FloatFunc2::applyPoint(__return_storage_ptr__,(FloatFunc2 *)this,ctx,x,y);
  if ((x < -1.79769313486232e+308 != x <= 1.79769313486232e+308) &&
     (((y != 0.0 || (NAN(y))) && (y < -1.79769313486232e+308 != y <= 1.79769313486232e+308)))) {
    tcu::FloatFormat::convert(&local_30,&ctx->format,__return_storage_ptr__);
    if ((local_30.m_lo <= -INFINITY) && (!NAN(local_30.m_hi))) {
      local_48.m_hi = (ctx->format).m_maxValue;
      local_48.m_hasNaN = NAN(local_48.m_hi);
      local_48.m_hi = -local_48.m_hi;
      local_48.m_lo = local_48.m_hi;
      if (local_48.m_hasNaN) {
        local_48.m_lo = INFINITY;
        local_48.m_hi = -INFINITY;
      }
      tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
    }
    if ((!NAN(local_30.m_lo)) && (INFINITY <= local_30.m_hi)) {
      local_48.m_hi = (ctx->format).m_maxValue;
      local_48.m_hasNaN = NAN(local_48.m_hi);
      local_48.m_lo = local_48.m_hi;
      if (local_48.m_hasNaN) {
        local_48.m_hi = -INFINITY;
        local_48.m_lo = INFINITY;
      }
      tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint		(const EvalContext&	ctx, double x, double y) const
	{
		Interval ret = FloatFunc2::applyPoint(ctx, x, y);

		if (!deIsInf(x) && !deIsInf(y) && y != 0.0)
		{
			const Interval dst = ctx.format.convert(ret);
			if (dst.contains(-TCU_INFINITY)) ret |= -ctx.format.getMaxValue();
			if (dst.contains(+TCU_INFINITY)) ret |= +ctx.format.getMaxValue();
		}

		return ret;
	}